

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O1

QIcon __thiscall
QCommonStylePrivate::iconFromResourceTheme
          (QCommonStylePrivate *this,StandardPixmap standardIcon,QStyleOption *option,
          QWidget *widget)

{
  QIcon QVar1;
  int iVar2;
  QStyle *pQVar3;
  size_type sVar4;
  byte bVar5;
  undefined8 uVar6;
  undefined1 *puVar7;
  char16_t *pcVar8;
  long lVar9;
  Mode mode;
  long in_FS_OFFSET;
  QStringView prefix;
  QStringView prefix_00;
  QStringView prefix_01;
  QStringView prefix_02;
  QLatin1StringView latin1;
  initializer_list<int> sizes;
  initializer_list<int> sizes_00;
  initializer_list<int> sizes_01;
  initializer_list<int> sizes_02;
  QIcon icon;
  State state;
  undefined8 local_58;
  QIcon local_50;
  QSize local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&local_50);
  if (0x4e < (uint)option) goto switchD_0033afad_caseD_18;
  pQVar3 = (QStyle *)
           ((long)&switchD_0033afad::switchdataD_006764f8 +
           (long)(int)(&switchD_0033afad::switchdataD_006764f8)[(ulong)option & 0xffffffff]);
  switch((ulong)option & 0xffffffff) {
  case 0:
    cachedPixmapFromXPM((char **)local_48);
    QIcon::addPixmap((QPixmap *)&local_50,(Mode)local_48,On);
    QPixmap::~QPixmap((QPixmap *)local_48);
    latin1.m_data = ":/qt-project.org/qmessagebox/images/qtlogo-64.png";
    latin1.m_size = 0x31;
    QString::QString((QString *)local_48,latin1);
    local_58 = 0xffffffffffffffff;
    QIcon::addFile((QString *)&local_50,local_48,(Mode)&local_58,On);
    if (local_48[0] != (QSize)0x0) {
      LOCK();
      *(int *)local_48[0] = *(int *)local_48[0] + -1;
      UNLOCK();
      if (*(int *)local_48[0] == 0) {
        QArrayData::deallocate((QArrayData *)local_48[0],2,0x10);
      }
    }
    goto switchD_0033afad_caseD_18;
  case 1:
    pcVar8 = L"titlebar-min-";
    goto LAB_0033b4d2;
  case 2:
    pcVar8 = L"titlebar-max-";
LAB_0033b4d2:
    puVar7 = _ZGRL13titleBarSizes_;
    goto LAB_0033b64f;
  case 3:
  case 8:
    pcVar8 = L"fusion_closedock-";
    lVar9 = 10;
    goto LAB_0033b4ba;
  case 4:
    pcVar8 = L"fusion_normalizedockup-";
    lVar9 = 0x10;
LAB_0033b4ba:
    pcVar8 = pcVar8 + 7;
    state = Off;
    puVar7 = _ZGRL18dockTitleIconSizes_;
    sVar4 = 6;
    goto LAB_0033b806;
  case 5:
    pcVar8 = L"titlebar-shade-";
    puVar7 = _ZGRL13titleBarSizes_;
    goto LAB_0033b441;
  case 6:
    pcVar8 = L"titlebar-unshade-";
    puVar7 = _ZGRL13titleBarSizes_;
    goto LAB_0033b2b3;
  case 7:
    pcVar8 = L"titlebar-contexthelp-";
    puVar7 = _ZGRL13titleBarSizes_;
    goto LAB_0033b607;
  case 9:
    pcVar8 = L"information-";
    goto LAB_0033b7f0;
  case 10:
    pcVar8 = L"warning-";
    goto LAB_0033b5dc;
  case 0xb:
    pcVar8 = L"critical-";
    goto LAB_0033b624;
  case 0xc:
    pcVar8 = L"question-";
    goto LAB_0033b624;
  case 0xd:
    local_48[0].wd.m_i = 0x10;
    local_48[0].ht.m_i = 0x20;
    pcVar8 = L"desktop-";
    goto LAB_0033b707;
  case 0xe:
    pcVar8 = L"trash-";
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 6;
    break;
  case 0xf:
    local_48[0].wd.m_i = 0x10;
    local_48[0].ht.m_i = 0x20;
    pcVar8 = L"computer-";
    lVar9 = 9;
    goto LAB_0033b711;
  case 0x10:
    pcVar8 = L"floppy-";
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 7;
    break;
  case 0x11:
    pcVar8 = L"harddrive-";
    goto LAB_0033b7cf;
  case 0x12:
    pcVar8 = L"cdr-";
    goto LAB_0033b512;
  case 0x13:
    pcVar8 = L"dvd-";
LAB_0033b512:
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 4;
    break;
  case 0x14:
    pcVar8 = L"networkdrive-";
    goto LAB_0033b648;
  case 0x15:
    pcVar8 = L"diropen-";
    goto LAB_0033b5dc;
  case 0x16:
    pcVar8 = L"dirclosed-";
    goto LAB_0033b7cf;
  case 0x17:
    pcVar8 = L"dirlink-";
LAB_0033b5dc:
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 8;
    break;
  default:
    goto switchD_0033afad_caseD_18;
  case 0x19:
    pcVar8 = L"file-";
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 5;
    break;
  case 0x1a:
    pcVar8 = L"filelink-";
    goto LAB_0033b624;
  case 0x1b:
    if (widget == (QWidget *)0x0) {
      iVar2 = QGuiApplication::layoutDirection();
    }
    else {
      iVar2 = *(int *)&widget->field_0xc;
    }
    pcVar8 = L"toolbar-ext-h-";
    if (iVar2 == 1) {
      pcVar8 = L"toolbar-ext-h-rtl-";
    }
    lVar9 = (ulong)(iVar2 == 1) * 4 + 0xe;
    puVar7 = _ZGRL16toolBarExtHSizes_;
    goto LAB_0033b899;
  case 0x1c:
    pcVar8 = L"toolbar-ext-v-";
    puVar7 = _ZGRL16toolBarExtVSizes_;
    lVar9 = 0xe;
LAB_0033b899:
    state = Off;
    sVar4 = 4;
    goto LAB_0033b806;
  case 0x1d:
    pcVar8 = L"filedialog_start-";
    puVar7 = _ZGRL12pngIconSizes_;
LAB_0033b2b3:
    lVar9 = 0x11;
    break;
  case 0x1e:
    pcVar8 = L"filedialog_end-";
    puVar7 = _ZGRL12pngIconSizes_;
LAB_0033b441:
    lVar9 = 0xf;
    break;
  case 0x1f:
    pQVar3 = QStyle::proxy(pQVar3);
    lVar9 = *(long *)pQVar3;
    uVar6 = 0x32;
    goto LAB_0033b5bc;
  case 0x20:
    pcVar8 = L"newdirectory-";
    goto LAB_0033b648;
  case 0x21:
    pcVar8 = L"viewdetailed-";
    goto LAB_0033b648;
  case 0x22:
    pcVar8 = L"fileinfo-";
    goto LAB_0033b624;
  case 0x23:
    pcVar8 = L"filecontents-";
LAB_0033b648:
    puVar7 = _ZGRL12pngIconSizes_;
LAB_0033b64f:
    lVar9 = 0xd;
    break;
  case 0x24:
    pcVar8 = L"viewlist-";
    goto LAB_0033b624;
  case 0x25:
    pQVar3 = QStyle::proxy(pQVar3);
    lVar9 = *(long *)pQVar3;
    uVar6 = 0x36;
LAB_0033b5bc:
    (**(code **)(lVar9 + 0x100))(this,pQVar3,uVar6,widget);
    goto LAB_0033b81f;
  case 0x26:
  case 0x38:
    prefix.m_data = L"dirclosed-";
    prefix.m_size = 10;
    sizes._M_len = 3;
    sizes._M_array = (iterator)_ZGRL12pngIconSizes_;
    addIconFiles<int>(prefix,sizes,&local_50,Normal,Off);
    state = On;
    pcVar8 = L"diropen-";
    lVar9 = 8;
    sVar4 = 3;
    puVar7 = _ZGRL12pngIconSizes_;
    goto LAB_0033b806;
  case 0x27:
    pcVar8 = L"standardbutton-ok-";
    goto LAB_0033b111;
  case 0x28:
    pcVar8 = L"standardbutton-cancel-";
    goto LAB_0033b760;
  case 0x29:
    pcVar8 = L"standardbutton-help-";
    goto LAB_0033b73c;
  case 0x2a:
    pcVar8 = L"standardbutton-open-";
    goto LAB_0033b73c;
  case 0x2b:
    pcVar8 = L"standardbutton-save-";
    goto LAB_0033b73c;
  case 0x2c:
    pcVar8 = L"standardbutton-close-";
    goto LAB_0033b576;
  case 0x2d:
    pcVar8 = L"standardbutton-apply-";
    goto LAB_0033b576;
  case 0x2e:
    pcVar8 = L"standardbutton-clear-";
LAB_0033b576:
    puVar7 = _ZGRL12pngIconSizes_;
LAB_0033b607:
    lVar9 = 0x15;
    break;
  case 0x2f:
    pcVar8 = L"standardbutton-delete-";
LAB_0033b760:
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 0x16;
    break;
  case 0x30:
    pcVar8 = L"standardbutton-yes-";
    goto LAB_0033b692;
  case 0x31:
    pcVar8 = L"standardbutton-no-";
LAB_0033b111:
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 0x12;
    break;
  case 0x32:
    pcVar8 = L"arrow-up-";
LAB_0033b624:
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 9;
    break;
  case 0x33:
    pcVar8 = L"arrow-down-";
    goto LAB_0033b7ae;
  case 0x34:
    pcVar8 = L"arrow-left-";
    goto LAB_0033b7ae;
  case 0x35:
    pcVar8 = L"arrow-right-";
    goto LAB_0033b7f0;
  case 0x36:
    pQVar3 = QStyle::proxy(pQVar3);
    if (widget == (QWidget *)0x0) {
      iVar2 = QGuiApplication::layoutDirection();
    }
    else {
      iVar2 = *(int *)&widget->field_0xc;
    }
    bVar5 = iVar2 == 1 | 0x34;
    goto LAB_0033b8b3;
  case 0x37:
  case 0x39:
    pQVar3 = QStyle::proxy(pQVar3);
    if (widget == (QWidget *)0x0) {
      iVar2 = QGuiApplication::layoutDirection();
    }
    else {
      iVar2 = *(int *)&widget->field_0xc;
    }
    bVar5 = iVar2 == 1 ^ 0x35;
LAB_0033b8b3:
    (**(code **)(*(long *)pQVar3 + 0x100))(this,pQVar3,bVar5,widget);
    goto LAB_0033b81f;
  case 0x3b:
    local_48[0].wd.m_i = 0x18;
    local_48[0].ht.m_i = 0x20;
    pcVar8 = L"refresh-";
LAB_0033b707:
    lVar9 = 8;
    goto LAB_0033b711;
  case 0x3c:
    local_48[0].wd.m_i = 0x18;
    local_48[0].ht.m_i = 0x20;
    pcVar8 = L"stop-";
    lVar9 = 5;
LAB_0033b711:
    state = Off;
    puVar7 = (undefined1 *)local_48;
    sVar4 = 2;
    goto LAB_0033b806;
  case 0x3d:
    pcVar8 = L"media-play-";
    goto LAB_0033b7ae;
  case 0x3e:
    pcVar8 = L"media-stop-";
LAB_0033b7ae:
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 0xb;
    break;
  case 0x3f:
    pcVar8 = L"media-pause-";
LAB_0033b7f0:
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 0xc;
    break;
  case 0x40:
    pcVar8 = L"media-skip-forward-";
    goto LAB_0033b692;
  case 0x41:
    pcVar8 = L"media-skip-backward-";
    goto LAB_0033b73c;
  case 0x42:
    pcVar8 = L"media-seek-forward-";
LAB_0033b692:
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 0x13;
    break;
  case 0x43:
    pcVar8 = L"media-seek-backward-";
LAB_0033b73c:
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 0x14;
    break;
  case 0x44:
    pcVar8 = L"media-volume-";
    lVar9 = 0xd;
    goto LAB_0033b799;
  case 0x45:
    pcVar8 = L"media-volume-muted-";
    lVar9 = 0x13;
LAB_0033b799:
    local_48[0].wd.m_i = 0x10;
    state = Off;
    puVar7 = (undefined1 *)local_48;
    sVar4 = 1;
    goto LAB_0033b806;
  case 0x46:
    pcVar8 = L"cleartext-";
LAB_0033b7cf:
    puVar7 = _ZGRL12pngIconSizes_;
    lVar9 = 10;
    break;
  case 0x4e:
    prefix_00.m_data = L"standardbutton-closetab-";
    prefix_00.m_size = 0x18;
    sizes_00._M_len = 3;
    sizes_00._M_array = (iterator)_ZGRL12pngIconSizes_;
    addIconFiles<int>(prefix_00,sizes_00,&local_50,Normal,Off);
    prefix_01.m_data = L"standardbutton-closetab-down-";
    prefix_01.m_size = 0x1d;
    sizes_01._M_len = 3;
    sizes_01._M_array = (iterator)_ZGRL12pngIconSizes_;
    addIconFiles<int>(prefix_01,sizes_01,&local_50,Normal,On);
    state = Off;
    pcVar8 = L"standardbutton-closetab-hover-";
    lVar9 = 0x1e;
    sVar4 = 3;
    puVar7 = _ZGRL12pngIconSizes_;
    mode = Active;
    goto LAB_0033b809;
  }
  state = Off;
  sVar4 = 3;
LAB_0033b806:
  mode = Normal;
LAB_0033b809:
  prefix_02.m_data = pcVar8;
  prefix_02.m_size = lVar9;
  sizes_02._M_len = sVar4;
  sizes_02._M_array = (iterator)puVar7;
  addIconFiles<int>(prefix_02,sizes_02,&local_50,mode,state);
switchD_0033afad_caseD_18:
  QVar1.d = local_50.d;
  local_50.d = (QIconPrivate *)0x0;
  *(QIconPrivate **)&this->super_QStylePrivate = QVar1.d;
LAB_0033b81f:
  QIcon::~QIcon(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QIcon)(QIconPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QCommonStylePrivate::iconFromResourceTheme(QCommonStyle::StandardPixmap standardIcon,
                                                 const QStyleOption *option,
                                                 const QWidget *widget) const
{
    Q_Q(const QCommonStyle);
    QIcon icon;
#ifndef QT_NO_IMAGEFORMAT_PNG
    switch (standardIcon) {
    case QStyle::SP_MessageBoxInformation:
        addIconFiles(u"information-", pngIconSizes, icon);
        break;
    case QStyle::SP_MessageBoxWarning:
        addIconFiles(u"warning-", pngIconSizes, icon);
        break;
    case QStyle::SP_MessageBoxCritical:
        addIconFiles(u"critical-", pngIconSizes, icon);
        break;
    case QStyle::SP_MessageBoxQuestion:
        addIconFiles(u"question-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogStart:
        addIconFiles(u"filedialog_start-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogEnd:
        addIconFiles(u"filedialog_end-", pngIconSizes, icon);
        break;
    case QStyle::SP_TitleBarMinButton:
        addIconFiles(u"titlebar-min-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarMaxButton:
        addIconFiles(u"titlebar-max-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarShadeButton:
        addIconFiles(u"titlebar-shade-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarUnshadeButton:
        addIconFiles(u"titlebar-unshade-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarContextHelpButton:
        addIconFiles(u"titlebar-contexthelp-", titleBarSizes, icon);
        break;
     case QStyle::SP_FileDialogNewFolder:
        addIconFiles(u"newdirectory-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogBack:
        return q->proxy()->standardIcon(QStyle::SP_ArrowBack, option, widget);
    case QStyle::SP_FileDialogToParent:
        return q->proxy()->standardIcon(QStyle::SP_ArrowUp, option, widget);
    case QStyle::SP_FileDialogDetailedView:
        addIconFiles(u"viewdetailed-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogInfoView:
        addIconFiles(u"fileinfo-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogContentsView:
        addIconFiles(u"filecontents-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogListView:
        addIconFiles(u"viewlist-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogOkButton:
        addIconFiles(u"standardbutton-ok-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogCancelButton:
        addIconFiles(u"standardbutton-cancel-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogHelpButton:
        addIconFiles(u"standardbutton-help-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogOpenButton:
        addIconFiles(u"standardbutton-open-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogSaveButton:
        addIconFiles(u"standardbutton-save-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogCloseButton:
        addIconFiles(u"standardbutton-close-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogApplyButton:
        addIconFiles(u"standardbutton-apply-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogResetButton:
        addIconFiles(u"standardbutton-clear-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogDiscardButton:
        addIconFiles(u"standardbutton-delete-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogYesButton:
        addIconFiles(u"standardbutton-yes-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogNoButton:
        addIconFiles(u"standardbutton-no-", pngIconSizes, icon);
        break;
    case QStyle::SP_CommandLink:
    case QStyle::SP_ArrowForward:
        return q->proxy()->standardIcon(rtl(option) ? QStyle::SP_ArrowLeft
                                                    : QStyle::SP_ArrowRight,
                                        option, widget);
    case QStyle::SP_ArrowBack:
        return q->proxy()->standardIcon(rtl(option) ? QStyle::SP_ArrowRight
                                                    : QStyle::SP_ArrowLeft,
                                        option, widget);
    case QStyle::SP_ArrowLeft:
        addIconFiles(u"arrow-left-", pngIconSizes, icon);
        break;
    case QStyle::SP_ArrowRight:
        addIconFiles(u"arrow-right-", pngIconSizes, icon);
        break;
    case QStyle::SP_ArrowUp:
        addIconFiles(u"arrow-up-", pngIconSizes, icon);
        break;
    case QStyle::SP_ArrowDown:
        addIconFiles(u"arrow-down-", pngIconSizes, icon);
        break;
   case QStyle::SP_DirHomeIcon:
   case QStyle::SP_DirIcon:
        addIconFiles(u"dirclosed-", pngIconSizes, icon, QIcon::Normal, QIcon::Off);
        addIconFiles(u"diropen-", pngIconSizes, icon, QIcon::Normal, QIcon::On);
        break;
    case QStyle::SP_DirOpenIcon:
        addIconFiles(u"diropen-", pngIconSizes, icon);
        break;
    case QStyle::SP_DirClosedIcon:
        addIconFiles(u"dirclosed-", pngIconSizes, icon);
        break;
    case QStyle::SP_DirLinkIcon:
        addIconFiles(u"dirlink-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveCDIcon:
        addIconFiles(u"cdr-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveFDIcon:
        addIconFiles(u"floppy-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveHDIcon:
        addIconFiles(u"harddrive-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveDVDIcon:
        addIconFiles(u"dvd-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveNetIcon:
        addIconFiles(u"networkdrive-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileIcon:
        addIconFiles(u"file-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileLinkIcon:
        addIconFiles(u"filelink-", pngIconSizes, icon);
        break;
    case QStyle::SP_DesktopIcon:
        addIconFiles(u"desktop-", {16, 32}, icon);
        break;
    case QStyle::SP_TrashIcon:
        addIconFiles(u"trash-", pngIconSizes, icon);
        break;
    case QStyle::SP_ComputerIcon:
        addIconFiles(u"computer-", {16, 32}, icon);
        break;
    case QStyle::SP_BrowserReload:
        addIconFiles(u"refresh-", {24, 32}, icon);
        break;
    case QStyle::SP_BrowserStop:
        addIconFiles(u"stop-", {24, 32}, icon);
        break;
    case QStyle::SP_MediaPlay:
        addIconFiles(u"media-play-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaPause:
        addIconFiles(u"media-pause-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaStop:
        addIconFiles(u"media-stop-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSeekForward:
        addIconFiles(u"media-seek-forward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSeekBackward:
        addIconFiles(u"media-seek-backward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSkipForward:
        addIconFiles(u"media-skip-forward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSkipBackward:
        addIconFiles(u"media-skip-backward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaVolume:
        addIconFiles(u"media-volume-", {16}, icon);
        break;
    case QStyle::SP_MediaVolumeMuted:
        addIconFiles(u"media-volume-muted-", {16}, icon);
        break;
    case QStyle::SP_TitleBarCloseButton:
    case QStyle::SP_DockWidgetCloseButton:
        addIconFiles(u"closedock-", dockTitleIconSizes, icon);
        break;
    case QStyle::SP_TitleBarMenuButton:
#  ifndef QT_NO_IMAGEFORMAT_XPM
        icon.addPixmap(titleBarMenuCachedPixmapFromXPM());
#  endif
        icon.addFile(":/qt-project.org/qmessagebox/images/qtlogo-64.png"_L1);
        break;
    case QStyle::SP_TitleBarNormalButton:
        addIconFiles(u"normalizedockup-", dockTitleIconSizes, icon);
        break;
    case QStyle::SP_ToolBarHorizontalExtensionButton:
        addIconFiles(rtl(option) ? u"toolbar-ext-h-rtl-"_sv : u"toolbar-ext-h-"_sv, toolBarExtHSizes, icon);
        break;
    case QStyle::SP_ToolBarVerticalExtensionButton:
        addIconFiles(u"toolbar-ext-v-", toolBarExtVSizes, icon);
        break;
    case QStyle::SP_TabCloseButton:
        addIconFiles(u"standardbutton-closetab-", pngIconSizes, icon, QIcon::Normal, QIcon::Off);
        addIconFiles(u"standardbutton-closetab-down-", pngIconSizes, icon, QIcon::Normal, QIcon::On);
        addIconFiles(u"standardbutton-closetab-hover-", pngIconSizes, icon, QIcon::Active, QIcon::Off);
        break;
    case QStyle::SP_LineEditClearButton:
        addIconFiles(u"cleartext-", pngIconSizes, icon);
        break;
    default:
        break;
    }
#else // QT_NO_IMAGEFORMAT_PNG
    Q_UNUSED(standardIcon);
    Q_UNUSED(option);
    Q_UNUSED(widget);
#endif // QT_NO_IMAGEFORMAT_PNG
    return icon;
}